

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.hh
# Opt level: O0

void __thiscall tinyusdz::Stage::Stage(Stage *this)

{
  Stage *this_local;
  
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::vector(&this->_root_nodes);
  std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::multiset(&this->_root_node_nameSet);
  std::__cxx11::string::string((string *)&this->name);
  this->default_root_node = -1;
  LayerMetas::LayerMetas(&this->stage_metas);
  std::__cxx11::string::string((string *)&this->_err);
  std::__cxx11::string::string((string *)&this->_warn);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  ::map(&this->_prim_path_cache);
  std::
  map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
  ::map(&this->_prim_id_cache);
  this->_dirty = true;
  this->_prim_id_dirty = true;
  HandleAllocator<unsigned_long>::HandleAllocator(&this->_prim_id_allocator);
  return;
}

Assistant:

static Stage CreateInMemory() { return Stage(); }